

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O3

wchar_t cesu8_to_unicode(uint32_t *pwc,char *s,size_t n)

{
  uint32_t uVar1;
  wchar_t wVar2;
  uint32_t wc2;
  uint32_t local_30;
  uint32_t local_2c;
  
  local_2c = 0;
  wVar2 = _utf8_to_unicode(&local_2c,s,n);
  uVar1 = local_2c;
  if ((local_2c & 0xfffffc00) == 0xd800 && (wVar2 ^ 3U) == 0) {
    local_30 = 0;
    if (n - 3 < 3) {
LAB_004b764f:
      *pwc = 0xfffd;
      return L'\xfffffffd';
    }
    wVar2 = _utf8_to_unicode(&local_30,s + 3,n - 3);
    if ((local_30 & 0xfffffc00) != 0xdc00 || wVar2 != L'\x03') {
      *pwc = 0xfffd;
      if (L'\0' < wVar2) {
        return -wVar2;
      }
      return wVar2;
    }
    local_2c = uVar1 * 0x400 + local_30 + 0xfca02400;
    wVar2 = L'\x06';
  }
  else if ((wVar2 ^ 3U) == 0 && (local_2c & 0xfffffc00) == 0xdc00) goto LAB_004b764f;
  *pwc = local_2c;
  return wVar2;
}

Assistant:

static int
cesu8_to_unicode(uint32_t *pwc, const char *s, size_t n)
{
	uint32_t wc = 0;
	int cnt;

	cnt = _utf8_to_unicode(&wc, s, n);
	if (cnt == 3 && IS_HIGH_SURROGATE_LA(wc)) {
		uint32_t wc2 = 0;
		if (n - 3 < 3) {
			/* Invalid byte sequence. */
			goto invalid_sequence;
		}
		cnt = _utf8_to_unicode(&wc2, s+3, n-3);
		if (cnt != 3 || !IS_LOW_SURROGATE_LA(wc2)) {
			/* Invalid byte sequence. */
			goto invalid_sequence;
		}
		wc = combine_surrogate_pair(wc, wc2);
		cnt = 6;
	} else if (cnt == 3 && IS_LOW_SURROGATE_LA(wc)) {
		/* Invalid byte sequence. */
		goto invalid_sequence;
	}
	*pwc = wc;
	return (cnt);
invalid_sequence:
	*pwc = UNICODE_R_CHAR;/* set the Replacement Character instead. */
	if (cnt > 0)
		cnt *= -1;
	return (cnt);
}